

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::mouseMoveEvent(Picker *this,QMouseEvent *event)

{
  PickerPrivate *pPVar1;
  QMouseEvent QVar2;
  int iVar3;
  QPoint QVar4;
  int iVar5;
  
  pPVar1 = (this->d).d;
  if (pPVar1->leftMouseButtonPressed == true) {
    pPVar1->mouseWasMoved = true;
    QVar4 = QMouseEvent::pos(event);
    pPVar1 = (this->d).d;
    iVar3 = QVar4.yp - (pPVar1->mousePos).yp;
    iVar5 = -iVar3;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
    pPVar1->mouseMoveDelta = pPVar1->mouseMoveDelta + iVar5;
    pPVar1->drawItemOffset = pPVar1->drawItemOffset + iVar3;
    QVar4 = QMouseEvent::pos(event);
    ((this->d).d)->mousePos = QVar4;
    QWidget::update();
    QVar2 = (QMouseEvent)0x1;
  }
  else {
    QVar2 = (QMouseEvent)0x0;
  }
  event[0xc] = QVar2;
  return;
}

Assistant:

void
Picker::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		d->mouseWasMoved = true;

		const int delta = event->pos().y() - d->mousePos.y();
		d->mouseMoveDelta += qAbs( delta );
		d->drawItemOffset += delta;
		d->mousePos = event->pos();
		update();

		event->accept();
	}
	else
		event->ignore();
}